

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

char * GetBailOutKindName(BailOutKind kind)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  int iVar4;
  undefined4 *puVar5;
  char *pcVar6;
  long lVar7;
  
  if (kind < BailOutOnOverflow) {
    pcVar6 = BailOutKindNames[kind];
  }
  else {
    BVar3 = kind & ~BailOutKindBits;
    if ((kind & ~BailOutKindBits) == BailOutInvalid) {
      lVar7 = 0;
    }
    else {
      kind = kind & BailOutKindBits;
      iVar4 = sprintf_s(GetBailOutKindName::name,0x200,"%s",BailOutKindNames[BVar3]);
      lVar7 = (long)iVar4;
    }
    if ((kind >> 10 & 1) != 0) {
      kind = kind & ~BailOutOnOverflow;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutOnOverflow");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0xb & 1) != 0) {
      kind = kind & ~BailOutOnMulOverflow;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutOnMulOverflow"
                       );
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0xc & 1) != 0) {
      kind = kind & ~BailOutOnNegativeZero;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutOnNegativeZero");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0xd & 1) != 0) {
      kind = kind & ~BailOutOnPowIntIntOverflow;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutOnPowIntIntOverflow");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0xe & 1) != 0) {
      kind = kind & ~BailOutOnMissingValue;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutOnMissingValue");
      lVar7 = lVar7 + iVar4;
    }
    if ((short)kind < 0) {
      kind = kind & ~BailOutConventionalNativeArrayAccessOnly;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutConventionalNativeArrayAccessOnly");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x10 & 1) != 0) {
      kind = kind & ~BailOutConvertedNativeArray;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutConvertedNativeArray");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x11 & 1) != 0) {
      kind = kind & ~BailOutOnArrayAccessHelperCall;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutOnArrayAccessHelperCall");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x12 & 1) != 0) {
      kind = kind & ~BailOutOnInvalidatedArrayHeadSegment;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutOnInvalidatedArrayHeadSegment");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x13 & 1) != 0) {
      kind = kind & ~BailOutOnInvalidatedArrayLength;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutOnInvalidatedArrayLength");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x14 & 1) != 0) {
      kind = kind & ~BailOnStackArgsOutOfActualsRange;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOnStackArgsOutOfActualsRange");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x15 & 1) != 0) {
      kind = kind & ~BailOutForceByFlag;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutForceByFlag");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x16 & 1) != 0) {
      kind = kind & ~BailOutBreakPointInFunction;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutBreakPointInFunction");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x17 & 1) != 0) {
      kind = kind & ~BailOutStackFrameBase;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutStackFrameBase");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x18 & 1) != 0) {
      kind = kind & ~BailOutLocalValueChanged;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutLocalValueChanged");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x19 & 1) != 0) {
      kind = kind & ~BailOutExplicit;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutExplicit");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x1a & 1) != 0) {
      kind = kind & ~BailOutStep;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutStep");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x1b & 1) != 0) {
      kind = kind & ~BailOutIgnoreException;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutIgnoreException");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x1c & 1) != 0) {
      kind = kind & ~BailOutOnDivByZero;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutOnDivByZero");
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x1d & 1) != 0) {
      kind = kind & ~BailOutOnDivOfMinInt;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"BailOutOnDivOfMinInt"
                       );
      lVar7 = lVar7 + iVar4;
    }
    if ((kind >> 0x1e & 1) != 0) {
      kind = kind & ~BailOutMarkTempObject;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,
                        "BailOutMarkTempObject");
      lVar7 = lVar7 + iVar4;
    }
    if ((int)kind < 0) {
      kind = kind & ~LazyBailOut;
      pcVar6 = " | %s";
      if (lVar7 == 0) {
        pcVar6 = "%s";
      }
      iVar4 = sprintf_s(GetBailOutKindName::name + lVar7,0x200 - lVar7,pcVar6,"LazyBailOut");
      lVar7 = lVar7 + iVar4;
    }
    if (lVar7 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0xb65,"(position != 0)","position != 0");
      if (!bVar2) goto LAB_00966791;
      *puVar5 = 0;
    }
    pcVar6 = GetBailOutKindName::name;
    if (kind != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                         ,0xb66,"(!kind)","!kind");
      if (!bVar2) {
LAB_00966791:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return pcVar6;
}

Assistant:

const char* GetBailOutKindName(IR::BailOutKind kind)
{
    using namespace IR;

    if (!(kind & BailOutKindBits))
    {
        return BailOutKindNames[kind];
    }

    static char name[512];
    size_t position = 0;
    const auto normalKind = kind & ~BailOutKindBits;
    if (normalKind != 0)
    {
        kind -= normalKind;
        position +=
            sprintf_s(
                &name[position],
                sizeof(name) / sizeof(name[0]) - position * sizeof(name[0]),
                position == 0 ? "%s" : " | %s",
                BailOutKindNames[normalKind]);
    }

    uint offset = 1;
    if (kind & BailOutOnOverflow)
    {
        kind ^= BailOutOnOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnMulOverflow)
    {
        kind ^= BailOutOnMulOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnNegativeZero)
    {
        kind ^= BailOutOnNegativeZero;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnPowIntIntOverflow)
    {
        kind ^= BailOutOnPowIntIntOverflow;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutOnResultConditions

    ++offset;
    if (kind & BailOutOnMissingValue)
    {
        kind ^= BailOutOnMissingValue;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutConventionalNativeArrayAccessOnly)
    {
        kind ^= BailOutConventionalNativeArrayAccessOnly;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutConvertedNativeArray)
    {
        kind ^= BailOutConvertedNativeArray;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnArrayAccessHelperCall)
    {
        kind ^= BailOutOnArrayAccessHelperCall;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnInvalidatedArrayHeadSegment)
    {
        kind ^= BailOutOnInvalidatedArrayHeadSegment;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnInvalidatedArrayLength)
    {
        kind ^= BailOutOnInvalidatedArrayLength;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOnStackArgsOutOfActualsRange)
    {
        kind ^= BailOnStackArgsOutOfActualsRange;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutForArrayBits

    ++offset;
    if (kind & BailOutForceByFlag)
    {
        kind ^= BailOutForceByFlag;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutBreakPointInFunction)
    {
        kind ^= BailOutBreakPointInFunction;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutStackFrameBase)
    {
        kind ^= BailOutStackFrameBase;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutLocalValueChanged)
    {
        kind ^= BailOutLocalValueChanged;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutExplicit)
    {
        kind ^= BailOutExplicit;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutStep)
    {
        kind ^= BailOutStep;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutIgnoreException)
    {
        kind ^= BailOutIgnoreException;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutForDebuggerBits

    ++offset;
    if (kind & BailOutOnDivByZero)
    {
        kind ^= BailOutOnDivByZero;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    if (kind & BailOutOnDivOfMinInt)
    {
        kind ^= BailOutOnDivOfMinInt;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutOnDivSrcConditions

    ++offset;
    if (kind & BailOutMarkTempObject)
    {
        kind ^= BailOutMarkTempObject;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;

    if (kind & LazyBailOut)
    {
        kind ^= LazyBailOut;
        position += ConcatBailOutKindBits(name, sizeof(name), position, offset);
    }
    ++offset;
    // BailOutKindBits

    Assert(position != 0);
    Assert(!kind);
    return name;
}